

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rejectLeave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int leaveNum,SPxId leaveId,Status leaveStat,
             SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  Status **ppSVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  
  lVar10 = (long)leaveNum;
  if (leaveId.super_DataKey.info < 0) {
    ppSVar11 = &(this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
    if (leaveStat != D_ON_BOTH) goto LAB_003a42be;
    bVar16 = (*ppSVar11)[lVar10] == P_ON_LOWER;
    lVar12 = 0xb90;
    lVar15 = 0xba8;
    lVar14 = 0xba8;
  }
  else {
    ppSVar11 = &(this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
    if (leaveStat != D_ON_BOTH) goto LAB_003a42be;
    bVar16 = (*ppSVar11)[lVar10] == P_ON_UPPER;
    lVar12 = 0xbc0;
    lVar15 = 0xbd8;
    lVar14 = 0xbd8;
  }
  lVar13 = lVar12;
  if (bVar16) {
    lVar13 = lVar15;
    lVar14 = lVar12;
  }
  lVar14 = *(long *)((long)&(this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray + lVar14);
  lVar15 = lVar10 * 0x50;
  lVar12 = *(long *)((long)&(this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray + lVar13);
  uVar3 = *(undefined8 *)(lVar14 + lVar15);
  uVar4 = ((undefined8 *)(lVar14 + lVar15))[1];
  puVar1 = (undefined8 *)(lVar14 + 0x10 + lVar15);
  uVar5 = *puVar1;
  uVar6 = puVar1[1];
  puVar1 = (undefined8 *)(lVar14 + 0x20 + lVar15);
  uVar7 = *puVar1;
  uVar8 = puVar1[1];
  puVar1 = (undefined8 *)(lVar14 + 0x30 + lVar15);
  uVar9 = puVar1[1];
  puVar2 = (undefined8 *)(lVar12 + 0x30 + lVar15);
  *puVar2 = *puVar1;
  puVar2[1] = uVar9;
  puVar1 = (undefined8 *)(lVar12 + 0x20 + lVar15);
  *puVar1 = uVar7;
  puVar1[1] = uVar8;
  puVar1 = (undefined8 *)(lVar12 + 0x10 + lVar15);
  *puVar1 = uVar5;
  puVar1[1] = uVar6;
  *(undefined8 *)(lVar12 + lVar15) = uVar3;
  ((undefined8 *)(lVar12 + lVar15))[1] = uVar4;
  *(undefined4 *)(lVar12 + 0x40 + lVar15) = *(undefined4 *)(lVar14 + 0x40 + lVar15);
  *(undefined1 *)(lVar12 + 0x44 + lVar15) = *(undefined1 *)(lVar14 + 0x44 + lVar15);
  *(undefined8 *)(lVar12 + 0x48 + lVar15) = *(undefined8 *)(lVar14 + 0x48 + lVar15);
LAB_003a42be:
  (*ppSVar11)[lVar10] = leaveStat;
  return;
}

Assistant:

void SPxSolverBase<R>::rejectLeave(
   int leaveNum,
   SPxId leaveId,
   typename SPxBasisBase<R>::Desc::Status leaveStat,
   const SVectorBase<R>* //newVec
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(leaveId.isSPxRowId())
   {
      SPxOut::debug(this, "DLEAVE58 rejectLeave()  : row {}: {} -> {}\n", leaveNum,
                    ds.rowStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.rowStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_LOWER)
            theLRbound[leaveNum] = theURbound[leaveNum];
         else
            theURbound[leaveNum] = theLRbound[leaveNum];
      }

      ds.rowStatus(leaveNum) = leaveStat;
   }
   else
   {
      SPxOut::debug(this, "DLEAVE59 rejectLeave()  : col {}: {} -> {}\n", leaveNum,
                    ds.colStatus(leaveNum), leaveStat);

      if(leaveStat == SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(ds.colStatus(leaveNum) == SPxBasisBase<R>::Desc::P_ON_UPPER)
            theLCbound[leaveNum] = theUCbound[leaveNum];
         else
            theUCbound[leaveNum] = theLCbound[leaveNum];
      }

      ds.colStatus(leaveNum) = leaveStat;
   }
}